

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_argv.c
# Opt level: O3

ssize_t mpt_message_argv(mpt_message *msg,int sep)

{
  iovec *piVar1;
  ssize_t sVar2;
  ulong uVar3;
  ushort **ppuVar4;
  ulong uVar5;
  size_t ndat;
  iovec *piVar6;
  bool bVar7;
  iovec local_30;
  
  local_30.iov_base = msg->base;
  local_30.iov_len = msg->used;
  if (local_30.iov_len == 0) {
    ndat = msg->clen;
    do {
      bVar7 = ndat == 0;
      ndat = ndat - 1;
      if (bVar7) {
        return -0x10;
      }
      piVar6 = msg->cont;
      local_30.iov_base = piVar6->iov_base;
      msg->base = local_30.iov_base;
      local_30.iov_len = piVar6->iov_len;
      msg->used = local_30.iov_len;
      piVar6 = piVar6 + 1;
      msg->cont = piVar6;
      msg->clen = ndat;
    } while (local_30.iov_len == 0);
  }
  else {
    piVar6 = msg->cont;
    ndat = msg->clen;
  }
  if (sep == 0) {
    sep = 0;
  }
  else {
    sVar2 = mpt_memfcn(&local_30,1,notSpace,(void *)0x0);
    if (sVar2 < 0) {
      uVar3 = mpt_memfcn(piVar6,ndat,notSpace,(void *)0x0);
      if (-1 < (long)uVar3) {
        uVar5 = piVar6->iov_len;
        while (uVar5 < uVar3) {
          uVar3 = uVar3 - uVar5;
          ndat = ndat - 1;
          piVar1 = piVar6 + 1;
          piVar6 = piVar6 + 1;
          uVar5 = piVar1->iov_len;
        }
        local_30.iov_len = uVar5 - uVar3;
        local_30.iov_base = (void *)(uVar3 + (long)piVar6->iov_base);
        msg->base = local_30.iov_base;
        msg->used = local_30.iov_len;
        msg->cont = piVar6;
        msg->clen = ndat;
      }
    }
    else {
      local_30.iov_base = (void *)((long)local_30.iov_base + sVar2);
      msg->base = local_30.iov_base;
      local_30.iov_len = local_30.iov_len - sVar2;
      msg->used = local_30.iov_len;
    }
    ppuVar4 = __ctype_b_loc();
    if (-1 < (short)(*ppuVar4)[sep]) {
      sep = 0;
      sVar2 = mpt_memtok(&local_30,1,"\t \n\r\v",(char *)0x0,"\'\"");
      if (-1 < sVar2) {
        return sVar2;
      }
      if (ndat != 0) {
        sep = 0;
        sVar2 = mpt_memtok(piVar6,ndat,"\t \n\r\v",(char *)0x0,"\'\"");
        if (-1 < sVar2) {
          return sVar2 + local_30.iov_len;
        }
      }
    }
  }
  sVar2 = nextChar(&local_30,piVar6,ndat,sep);
  return sVar2;
}

Assistant:

extern ssize_t mpt_message_argv(MPT_STRUCT(message) *msg, int sep)
{
	struct iovec *cont;
	struct iovec curr;
	ssize_t part;
	size_t  clen;
	
	/* start on base data */
	curr.iov_base = (void *) msg->base;
	while (!(curr.iov_len = msg->used)) {
		if (!msg->clen) {
			return MPT_ERROR(MissingData);
		}
		curr.iov_base = (void *) (msg->base = msg->cont->iov_base);
		curr.iov_len = msg->used = msg->cont->iov_len;
		++msg->cont;
		--msg->clen;
	}
	cont = msg->cont;
	clen = msg->clen;
	
	/* find null character valid memory */
	if (!sep) {
		return nextChar(&curr, cont, clen, sep);
	}
	/* trim leading whitespace */
	if ((part = mpt_memfcn(&curr, 1, notSpace, 0)) >= 0) {
		msg->base = curr.iov_base = ((uint8_t *) curr.iov_base) + part;
		msg->used = curr.iov_len -= part;
	}
	else if ((part = mpt_memfcn(cont, clen, notSpace, 0)) >= 0) {
		while ((size_t) part > cont->iov_len) {
			part -= cont->iov_len;
			--clen;
			++cont;
		}
		msg->base = curr.iov_base = ((uint8_t *) cont->iov_base) + part;
		msg->used = curr.iov_len  = cont->iov_len - part;
		msg->cont = cont;
		msg->clen = clen;
	}
	/* find space character not in escapes */
	if (!isgraph(sep)) {
		if ((part = mpt_memtok(&curr, 1, "\t \n\r\v", NULL, "'\"")) >= 0) {
			return part;
		}
		if (clen && (part = mpt_memtok(cont, clen, "\t \n\r\v", NULL, "'\"")) >= 0) {
			return curr.iov_len + part;
		}
		sep = 0;
	}
	/* check for termination */
	return nextChar(&curr, cont, clen, sep);
}